

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp_inverse_linear.c
# Opt level: O0

void fe_warp_inverse_linear_set_parameters(char *param_str,float sampling_rate)

{
  int iVar1;
  double dVar2;
  int local_12c;
  char local_128 [4];
  int param_index;
  char temp_param_str [256];
  char *seps;
  char *tok;
  float sampling_rate_local;
  char *param_str_local;
  
  temp_param_str._248_8_ = anon_var_dwarf_83be;
  local_12c = 0;
  nyquist_frequency = sampling_rate / 2.0;
  if (param_str == (char *)0x0) {
    is_neutral = 1;
  }
  else {
    iVar1 = strcmp(param_str,p_str);
    if (iVar1 != 0) {
      is_neutral = 0;
      strcpy(local_128,param_str);
      memset(params,0,4);
      strcpy(p_str,param_str);
      seps = strtok(local_128,(char *)temp_param_str._248_8_);
      do {
        if (seps == (char *)0x0) break;
        dVar2 = atof_c(seps);
        iVar1 = local_12c + 1;
        params[local_12c] = (float)dVar2;
        seps = strtok((char *)0x0,(char *)temp_param_str._248_8_);
        local_12c = iVar1;
      } while (iVar1 < 1);
      if (seps != (char *)0x0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_warp_inverse_linear.c"
                ,0x81,"Inverse linear warping takes only one argument, %s ignored.\n",seps);
      }
      if ((params[0] == 0.0) && (!NAN(params[0]))) {
        is_neutral = 1;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_warp_inverse_linear.c"
                ,0x86,"Inverse linear warping cannot have slope zero, warping not applied.\n");
      }
    }
  }
  return;
}

Assistant:

void
fe_warp_inverse_linear_set_parameters(char const *param_str, float sampling_rate)
{
    char *tok;
    char *seps = " \t";
    char temp_param_str[256];
    int param_index = 0;

    nyquist_frequency = sampling_rate / 2;
    if (param_str == NULL) {
        is_neutral = YES;
        return;
    }
    /* The new parameters are the same as the current ones, so do nothing. */
    if (strcmp(param_str, p_str) == 0) {
        return;
    }
    is_neutral = NO;
    strcpy(temp_param_str, param_str);
    memset(params, 0, N_PARAM * sizeof(float));
    strcpy(p_str, param_str);
    /* FIXME: strtok() is not re-entrant... */
    tok = strtok(temp_param_str, seps);
    while (tok != NULL) {
        params[param_index++] = (float) atof_c(tok);
        tok = strtok(NULL, seps);
        if (param_index >= N_PARAM) {
            break;
        }
    }
    if (tok != NULL) {
        E_INFO
            ("Inverse linear warping takes only one argument, %s ignored.\n",
             tok);
    }
    if (params[0] == 0) {
        is_neutral = YES;
        E_INFO
            ("Inverse linear warping cannot have slope zero, warping not applied.\n");
    }
}